

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O1

int __thiscall cmCTestUpdateHandler::ProcessHandler(cmCTestUpdateHandler *this)

{
  string *content;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  int iVar4;
  cmCTest *pcVar5;
  char cVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  cmCTestP4 *this_00;
  long *plVar10;
  undefined8 *puVar11;
  ostream *poVar12;
  long lVar13;
  size_type *psVar14;
  ulong *puVar15;
  char *__s;
  int iVar16;
  undefined8 uVar17;
  int iVar18;
  string end_time;
  cmXMLWriter xml;
  ostringstream cmCTestLog_msg_3;
  time_point start_time_time;
  string buildname;
  string start_time;
  cmGeneratedFileStream os;
  cmCLocaleEnvironmentScope fixLocale;
  cmGeneratedFileStream ofs;
  undefined1 auStack_7a8 [8];
  string local_7a0;
  char local_77a;
  char local_779;
  string local_778;
  undefined1 local_758 [88];
  undefined1 local_700 [112];
  ios_base local_690 [264];
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_568;
  long local_560;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_558;
  string local_550;
  string local_530;
  string local_510;
  undefined1 local_4f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0 [6];
  ios_base local_480 [472];
  cmCLocaleEnvironmentScope local_2a8;
  undefined1 local_278 [112];
  ios_base local_208 [472];
  
  cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope(&local_2a8);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"SourceDirectory","");
  pcVar8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"Cannot find SourceDirectory  key in the DartConfiguration.tcl",
               0x3d);
    std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
    std::ostream::put((char)local_278);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x72,(char *)local_4f0._0_8_,false);
    if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
      operator_delete((void *)local_4f0._0_8_,local_4e0[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    std::ios_base::~ios_base(local_208);
    iVar18 = -1;
    goto LAB_001bd4da;
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
  bVar7 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
  if (!bVar7) {
    cmCTestGenericHandler::StartLogFile
              (&this->super_cmCTestGenericHandler,"Update",(cmGeneratedFileStream *)local_278);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4f0,"   Updating the repository: ",0x1c);
  sVar9 = strlen(pcVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,pcVar8,sVar9);
  std::ios::widen((char)(ostream *)local_4f0 + (char)*(_func_int **)(local_4f0._0_8_ + -0x18));
  std::ostream::put((char)local_4f0);
  std::ostream::flush();
  pcVar5 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x7e,(char *)local_700._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  pcVar3 = local_700 + 0x10;
  if ((char *)local_700._0_8_ != pcVar3) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
  std::ios_base::~ios_base(local_480);
  bVar7 = SelectVCS(this);
  iVar18 = -1;
  if (bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,"   Use ",7);
    if ((ulong)(uint)this->UpdateType < 7) {
      __s = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
    }
    else {
      __s = "Unknown";
    }
    if (__s == (char *)0x0) {
      std::ios::clear((int)(auStack_7a8 + (long)*(_func_int **)(local_4f0._0_8_ + -0x18)) + 0x2b8);
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,__s,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0," repository type",0x10)
    ;
    std::ios::widen((char)(ostream *)local_4f0 + (char)*(_func_int **)(local_4f0._0_8_ + -0x18));
    std::ostream::put((char)local_4f0);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x88,(char *)local_700._0_8_,(this->super_cmCTestGenericHandler).Quiet);
    if ((char *)local_700._0_8_ != pcVar3) {
      operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
    std::ios_base::~ios_base(local_480);
    switch(this->UpdateType) {
    case 1:
      this_00 = (cmCTestP4 *)operator_new(0x1b8);
      cmCTestCVS::cmCTestCVS
                ((cmCTestCVS *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_278);
      break;
    case 2:
      this_00 = (cmCTestP4 *)operator_new(0x330);
      cmCTestSVN::cmCTestSVN
                ((cmCTestSVN *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_278);
      break;
    case 3:
      this_00 = (cmCTestP4 *)operator_new(0x330);
      cmCTestBZR::cmCTestBZR
                ((cmCTestBZR *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_278);
      break;
    case 4:
      this_00 = (cmCTestP4 *)operator_new(0x318);
      cmCTestGIT::cmCTestGIT
                ((cmCTestGIT *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_278);
      break;
    case 5:
      this_00 = (cmCTestP4 *)operator_new(0x310);
      cmCTestHG::cmCTestHG
                ((cmCTestHG *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_278
                );
      break;
    case 6:
      this_00 = (cmCTestP4 *)operator_new(0x370);
      cmCTestP4::cmCTestP4(this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_278);
      break;
    default:
      this_00 = (cmCTestP4 *)operator_new(0x188);
      cmCTestVC::cmCTestVC
                ((cmCTestVC *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_278
                );
    }
    cmCTestVC::SetCommandLineTool((cmCTestVC *)this_00,&this->UpdateCommand);
    local_4f0._0_8_ = local_4f0 + 0x10;
    sVar9 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,pcVar8,pcVar8 + sVar9);
    cmCTestVC::SetSourceDirectory((cmCTestVC *)this_00,(string *)local_4f0);
    if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
      operator_delete((void *)local_4f0._0_8_,local_4e0[0]._M_allocated_capacity + 1);
    }
    cmCTestVC::Cleanup((cmCTestVC *)this_00);
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4f0,None);
    bVar7 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,PartUpdate,"Update",
                       (cmGeneratedFileStream *)local_4f0);
    if (bVar7) {
      cmCTest::CurrentTime_abi_cxx11_(&local_510,(this->super_cmCTestGenericHandler).CTest);
      local_558.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_560 = std::chrono::_V2::steady_clock::now();
      bVar7 = cmCTestVC::Update((cmCTestVC *)this_00);
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      local_758._0_8_ = local_758 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"BuildName","");
      cmCTest::GetCTestConfiguration((string *)local_700,pcVar5,(string *)local_758);
      cmCTest::SafeBuildIdField(&local_530,(string *)local_700);
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      if ((undefined1 *)local_758._0_8_ != local_758 + 0x10) {
        operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
      }
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_758,(ostream *)local_4f0,0);
      cmXMLWriter::StartDocument((cmXMLWriter *)local_758,"UTF-8");
      local_700._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"Update","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_758,"mode",(char (*) [7])0x53bf10);
      paVar1 = &local_7a0.field_2;
      local_7a0._M_dataplus._M_p = (pointer)paVar1;
      local_779 = bVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"ctest-","");
      cmVersion::GetCMakeVersion();
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_7a0);
      psVar14 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar14) {
        local_700._16_8_ = *psVar14;
        local_700._24_8_ = plVar10[3];
        local_700._0_8_ = pcVar3;
      }
      else {
        local_700._16_8_ = *psVar14;
        local_700._0_8_ = (size_type *)*plVar10;
      }
      local_700._8_8_ = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_758,"Generator",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      local_700._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"Site","");
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      paVar2 = &local_778.field_2;
      local_778._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"Site","");
      cmCTest::GetCTestConfiguration(&local_7a0,pcVar5,&local_778);
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_758,&local_7a0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_778._M_dataplus._M_p != paVar2) {
        operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"BuildName","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_758,&local_530);
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"BuildStamp","");
      cmCTest::GetCurrentTag_abi_cxx11_(&local_550,(this->super_cmCTestGenericHandler).CTest);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_550);
      puVar15 = (ulong *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_778.field_2._M_allocated_capacity = *puVar15;
        local_778.field_2._8_8_ = plVar10[3];
        local_778._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_778.field_2._M_allocated_capacity = *puVar15;
        local_778._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_778._M_string_length = plVar10[1];
      *plVar10 = (long)puVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cmCTest::GetTestModelString_abi_cxx11_(&local_588,(this->super_cmCTestGenericHandler).CTest);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_778._M_dataplus._M_p != paVar2) {
        uVar17 = local_778.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_588._M_string_length + local_778._M_string_length) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          uVar17 = local_588.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_588._M_string_length + local_778._M_string_length)
        goto LAB_001bca76;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_588,0,(char *)0x0,(ulong)local_778._M_dataplus._M_p);
      }
      else {
LAB_001bca76:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_778,(ulong)local_588._M_dataplus._M_p);
      }
      psVar14 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_7a0.field_2._M_allocated_capacity = *psVar14;
        local_7a0.field_2._8_8_ = puVar11[3];
        local_7a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_7a0.field_2._M_allocated_capacity = *psVar14;
        local_7a0._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_7a0._M_string_length = puVar11[1];
      *puVar11 = psVar14;
      puVar11[1] = 0;
      *(undefined1 *)psVar14 = 0;
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_758,&local_7a0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_778._M_dataplus._M_p != paVar2) {
        operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"StartDateTime","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_758,&local_510);
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"StartTime","");
      cmXMLWriter::
      Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((cmXMLWriter *)local_758,(string *)local_700,&local_558);
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"UpdateCommand","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      content = &(this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine;
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_758,content);
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"UpdateType","");
      if ((ulong)(uint)this->UpdateType < 7) {
        local_7a0._M_dataplus._M_p = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
      }
      else {
        local_7a0._M_dataplus._M_p = "Unknown";
      }
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      cmXMLWriter::Content<char_const*>((cmXMLWriter *)local_758,(char **)&local_7a0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      if ((char *)local_700._0_8_ != pcVar3) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_568 = content;
      local_77a = cmCTestVC::WriteXML((cmCTestVC *)this_00,(cmXMLWriter *)local_758);
      iVar18 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[0];
      if (iVar18 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_700,"   Found ",9);
        poVar12 = (ostream *)std::ostream::operator<<(local_700,iVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," updated files\n",0xf);
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xd2,local_7a0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        std::ios_base::~ios_base(local_690);
      }
      iVar16 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[1];
      if (iVar16 == 0) {
        iVar16 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_700,"   Found ",9);
        poVar12 = (ostream *)std::ostream::operator<<(local_700,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," locally modified files\n",0x18)
        ;
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xd7,local_7a0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
          operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        std::ios_base::~ios_base(local_690);
      }
      iVar4 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[2];
      if (iVar4 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_700,"   Found ",9);
        poVar12 = (ostream *)std::ostream::operator<<(local_700,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," conflicting files\n",0x13);
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xdd,local_7a0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
          operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        std::ios_base::~ios_base(local_690);
        iVar16 = iVar16 + iVar4;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
      pcVar8 = local_700 + 0x10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_700,"End",3);
      std::ios::widen((char)*(undefined8 *)(local_700._0_8_ + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0xe1,local_7a0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
      std::ios_base::~ios_base(local_690);
      cmCTest::CurrentTime_abi_cxx11_(&local_7a0,(this->super_cmCTestGenericHandler).CTest);
      local_700._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"EndDateTime","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_758,&local_7a0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      if ((char *)local_700._0_8_ != pcVar8) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"EndTime","");
      local_778._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
      cmXMLWriter::
      Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((cmXMLWriter *)local_758,(string *)local_700,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&local_778);
      if ((char *)local_700._0_8_ != pcVar8) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"ElapsedMinutes","");
      lVar13 = std::chrono::_V2::steady_clock::now();
      local_778._M_dataplus._M_p = (pointer)((lVar13 - local_560) / 60000000000);
      cmXMLWriter::Element<long>((cmXMLWriter *)local_758,(string *)local_700,(long *)&local_778);
      if ((char *)local_700._0_8_ != pcVar8) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      local_700._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"UpdateReturnStatus","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_758,(string *)local_700);
      if ((char *)local_700._0_8_ != pcVar8) {
        operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
      }
      cVar6 = local_779;
      if (iVar16 != 0) {
        cmXMLWriter::Content<char[72]>
                  ((cmXMLWriter *)local_758,
                   (char (*) [72])
                   "Update error: There are modified or conflicting files in the repository");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_700,
                   "   There are modified or conflicting files in the repository",0x3c);
        std::ios::widen((char)*(undefined8 *)(local_700._0_8_ + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xf0,local_778._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        std::ios_base::~ios_base(local_690);
      }
      if (cVar6 == '\0') {
        cmXMLWriter::Content<char[24]>
                  ((cmXMLWriter *)local_758,(char (*) [24])"Update command failed:\n");
        cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_758,local_568);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_700,"   Update command failed: ",0x1a);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_700,
                             (this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine.
                             _M_dataplus._M_p,
                             (this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine.
                             _M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xf7,local_778._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        std::ios_base::~ios_base(local_690);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      cmXMLWriter::EndElement((cmXMLWriter *)local_758);
      cmXMLWriter::EndDocument((cmXMLWriter *)local_758);
      if (local_77a == '\0') {
        iVar18 = -1;
      }
      if (cVar6 == '\0') {
        iVar18 = -1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_758);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_700,"Cannot open log file",0x14);
      std::ios::widen((char)*(undefined8 *)(local_700._0_8_ + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0xaf,(char *)local_758._0_8_,false);
      if ((undefined1 *)local_758._0_8_ != local_758 + 0x10) {
        operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
      std::ios_base::~ios_base(local_690);
      iVar18 = -1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4f0);
    (*(this_00->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[1])(this_00);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
LAB_001bd4da:
  cmCLocaleEnvironmentScope::~cmCLocaleEnvironmentScope(&local_2a8);
  return iVar18;
}

Assistant:

int cmCTestUpdateHandler::ProcessHandler()
{
  // Make sure VCS tool messages are in English so we can parse them.
  cmCLocaleEnvironmentScope fixLocale;
  static_cast<void>(fixLocale);

  // Get source dir
  const char* sourceDirectory = this->GetOption("SourceDirectory");
  if (!sourceDirectory) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find SourceDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  cmGeneratedFileStream ofs;
  if (!this->CTest->GetShowOnly()) {
    this->StartLogFile("Update", ofs);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Updating the repository: " << sourceDirectory
                                                    << std::endl,
                     this->Quiet);

  if (!this->SelectVCS()) {
    return -1;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Use "
                       << cmCTestUpdateHandlerUpdateToString(this->UpdateType)
                       << " repository type" << std::endl;
                     , this->Quiet);

  // Create an object to interact with the VCS tool.
  std::unique_ptr<cmCTestVC> vc;
  switch (this->UpdateType) {
    case e_CVS:
      vc = cm::make_unique<cmCTestCVS>(this->CTest, ofs);
      break;
    case e_SVN:
      vc = cm::make_unique<cmCTestSVN>(this->CTest, ofs);
      break;
    case e_BZR:
      vc = cm::make_unique<cmCTestBZR>(this->CTest, ofs);
      break;
    case e_GIT:
      vc = cm::make_unique<cmCTestGIT>(this->CTest, ofs);
      break;
    case e_HG:
      vc = cm::make_unique<cmCTestHG>(this->CTest, ofs);
      break;
    case e_P4:
      vc = cm::make_unique<cmCTestP4>(this->CTest, ofs);
      break;
    default:
      vc = cm::make_unique<cmCTestVC>(this->CTest, ofs);
      break;
  }
  vc->SetCommandLineTool(this->UpdateCommand);
  vc->SetSourceDirectory(sourceDirectory);

  // Cleanup the working tree.
  vc->Cleanup();

  //
  // Now update repository and remember what files were updated
  //
  cmGeneratedFileStream os;
  if (!this->StartResultingXML(cmCTest::PartUpdate, "Update", os)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open log file" << std::endl);
    return -1;
  }
  std::string start_time = this->CTest->CurrentTime();
  auto start_time_time = std::chrono::system_clock::now();
  auto elapsed_time_start = std::chrono::steady_clock::now();

  bool updated = vc->Update();
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(os);
  xml.StartDocument();
  xml.StartElement("Update");
  xml.Attribute("mode", "Client");
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  xml.Element("Site", this->CTest->GetCTestConfiguration("Site"));
  xml.Element("BuildName", buildname);
  xml.Element("BuildStamp",
              this->CTest->GetCurrentTag() + "-" +
                this->CTest->GetTestModelString());
  xml.Element("StartDateTime", start_time);
  xml.Element("StartTime", start_time_time);
  xml.Element("UpdateCommand", vc->GetUpdateCommandLine());
  xml.Element("UpdateType",
              cmCTestUpdateHandlerUpdateToString(this->UpdateType));

  bool loadedMods = vc->WriteXML(xml);

  int localModifications = 0;
  int numUpdated = vc->GetPathCount(cmCTestVC::PathUpdated);
  if (numUpdated) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numUpdated << " updated files\n",
                       this->Quiet);
  }
  if (int numModified = vc->GetPathCount(cmCTestVC::PathModified)) {
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      "   Found " << numModified << " locally modified files\n", this->Quiet);
    localModifications += numModified;
  }
  if (int numConflicting = vc->GetPathCount(cmCTestVC::PathConflicting)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numConflicting << " conflicting files\n",
                       this->Quiet);
    localModifications += numConflicting;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", std::chrono::system_clock::now());
  xml.Element("ElapsedMinutes",
              std::chrono::duration_cast<std::chrono::minutes>(
                std::chrono::steady_clock::now() - elapsed_time_start)
                .count());

  xml.StartElement("UpdateReturnStatus");
  if (localModifications) {
    xml.Content("Update error: "
                "There are modified or conflicting files in the repository");
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "   There are modified or conflicting files in the repository"
                 << std::endl);
  }
  if (!updated) {
    xml.Content("Update command failed:\n");
    xml.Content(vc->GetUpdateCommandLine());
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Update command failed: " << vc->GetUpdateCommandLine()
                                            << "\n");
  }
  xml.EndElement(); // UpdateReturnStatus
  xml.EndElement(); // Update
  xml.EndDocument();
  return updated && loadedMods ? numUpdated : -1;
}